

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

_Bool udp_check_pipe_sequence(udp_pipe *p,uint32_t seq)

{
  int iVar1;
  int32_t delta;
  uint32_t seq_local;
  udp_pipe *p_local;
  
  iVar1 = seq - p->peer_seq;
  if (iVar1 < 0) {
    nni_stat_inc(&p->ep->st_rcv_reorder,1);
    p_local._7_1_ = false;
  }
  else {
    if (0 < iVar1) {
      nni_stat_inc(&p->ep->st_rcv_reorder,1);
    }
    p->peer_seq = seq + 1;
    p_local._7_1_ = true;
  }
  return p_local._7_1_;
}

Assistant:

static bool
udp_check_pipe_sequence(udp_pipe *p, uint32_t seq)
{
	int32_t delta;
	// signed math so we can see how far apart they are
	delta = (int32_t) (seq - p->peer_seq);
	if (delta < 0) {
		// out of order delivery
		nni_stat_inc(&p->ep->st_rcv_reorder, 1);
		return (false);
	}
	if (delta > 0) {
		nni_stat_inc(&p->ep->st_rcv_reorder, 1);
	}
	p->peer_seq = seq + 1; // expected next sequence number
	return (true);
}